

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O3

bool gflags::AppendFlagsIntoFile(string *filename,char *prog_name)

{
  pointer pCVar1;
  bool bVar2;
  int iVar3;
  FILE *__stream;
  int *piVar4;
  vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> *extraout_RDX;
  vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> *extraout_RDX_00
  ;
  vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> *extraout_RDX_01
  ;
  vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> *flags_00;
  iterator __position;
  vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> flags;
  vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> local_58;
  string local_40;
  
  __stream = fopen((filename->_M_dataplus)._M_p,"a");
  if ((__stream == (FILE *)0x0) && (piVar4 = __errno_location(), *piVar4 != 0)) {
    bVar2 = false;
  }
  else {
    if (prog_name != (char *)0x0) {
      fprintf(__stream,"%s\n",prog_name);
    }
    local_58.
    super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>.
    _M_impl.super__Vector_impl_data._M_start = (CommandLineFlagInfo *)0x0;
    local_58.
    super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish = (CommandLineFlagInfo *)0x0;
    local_58.
    super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetAllFlags(&local_58);
    pCVar1 = local_58.
             super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    flags_00 = extraout_RDX;
    for (__position._M_current =
              local_58.
              super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
              ._M_impl.super__Vector_impl_data._M_start; __position._M_current != pCVar1;
        __position._M_current = __position._M_current + 1) {
      iVar3 = strcmp(((__position._M_current)->name)._M_dataplus._M_p,"flagfile");
      if (iVar3 == 0) {
        std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>::
        _M_erase(&local_58,__position);
        flags_00 = extraout_RDX_01;
        break;
      }
      flags_00 = extraout_RDX_00;
    }
    TheseCommandlineFlagsIntoString_abi_cxx11_(&local_40,(gflags *)&local_58,flags_00);
    fputs(local_40._M_dataplus._M_p,__stream);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    fclose(__stream);
    std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>::~vector
              (&local_58);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool AppendFlagsIntoFile(const string& filename, const char *prog_name) {
  FILE *fp;
  if (SafeFOpen(&fp, filename.c_str(), "a") != 0) {
    return false;
  }

  if (prog_name)
    fprintf(fp, "%s\n", prog_name);

  vector<CommandLineFlagInfo> flags;
  GetAllFlags(&flags);
  // But we don't want --flagfile, which leads to weird recursion issues
  vector<CommandLineFlagInfo>::iterator i;
  for (i = flags.begin(); i != flags.end(); ++i) {
    if (strcmp(i->name.c_str(), "flagfile") == 0) {
      flags.erase(i);
      break;
    }
  }
  fprintf(fp, "%s", TheseCommandlineFlagsIntoString(flags).c_str());

  fclose(fp);
  return true;
}